

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O1

Sensor * __thiscall
iDynTree::SensorsList::getSensor(SensorsList *this,SensorType *sensor_type,ptrdiff_t sensor_index)

{
  pointer pvVar1;
  long lVar2;
  ostream *this_00;
  long *plVar3;
  Sensor *pSVar4;
  
  if ((sensor_index < 0) ||
     (pvVar1 = (this->pimpl->allSensors).
               super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     lVar2 = *(long *)&pvVar1[*sensor_type].
                       super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>.
                       _M_impl,
     (int)((ulong)((long)*(pointer *)
                          ((long)&pvVar1[*sensor_type].
                                  super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>
                                  ._M_impl + 8) - lVar2) >> 3) <= sensor_index)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[ERROR] getSensor did not find sensor ",0x26);
    this_00 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(this_00," of type ",9);
    plVar3 = (long *)std::ostream::operator<<((ostream *)this_00,*sensor_type);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    pSVar4 = (Sensor *)0x0;
  }
  else {
    pSVar4 = *(Sensor **)(lVar2 + sensor_index * 8);
  }
  return pSVar4;
}

Assistant:

Sensor* SensorsList::getSensor(const SensorType& sensor_type, std::ptrdiff_t sensor_index) const
{
    if( sensor_index < (int)getNrOfSensors(sensor_type) && sensor_index >= 0 )
    {
        return this->pimpl->allSensors[sensor_type][sensor_index];
    }
    else
    {
        std::cerr << "[ERROR] getSensor did not find sensor "
                  << sensor_index << " of type " << sensor_type
                  << std::endl;
        return 0;
    }
}